

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbararealayout.cpp
# Opt level: O0

QList<int> * __thiscall QToolBarAreaLayout::gapIndex(QToolBarAreaLayout *this,QPoint *pos)

{
  long lVar1;
  bool bVar2;
  QPoint *in_RSI;
  QRect *in_RDI;
  long in_FS_OFFSET;
  int *unaff_retaddr;
  QPoint *in_stack_00000008;
  QToolBarAreaLayoutInfo *in_stack_00000010;
  int i;
  LayoutDirection dir;
  QList<int> *ret;
  QList<int> result;
  QPoint p;
  int minDistance;
  QRect *boundingRect;
  LayoutDirection direction;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  boundingRect = in_RDI;
  QWidget::layoutDirection((QWidget *)0x6f4604);
  *(undefined1 **)boundingRect = &DAT_aaaaaaaaaaaaaaaa;
  *(undefined1 **)&boundingRect->x2 = &DAT_aaaaaaaaaaaaaaaa;
  *(undefined1 **)(boundingRect + 1) = &DAT_aaaaaaaaaaaaaaaa;
  QList<int>::QList((QList<int> *)0x6f463f);
  for (direction = LeftToRight; (int)direction < 4; direction = direction + RightToLeft) {
    if (in_RSI[(long)(int)direction * 7 + 8].xp.m_i == 1) {
      QStyle::visualPos(direction,boundingRect,in_RSI);
    }
    QToolBarAreaLayoutInfo::gapIndex(in_stack_00000010,in_stack_00000008,unaff_retaddr);
    bVar2 = QList<int>::isEmpty((QList<int> *)0x6f4713);
    if (!bVar2) {
      QList<int>::prepend((QList<int> *)0x6f4725,(parameter_type)((ulong)in_RDI >> 0x20));
      QList<int>::operator=((QList<int> *)in_RSI,(QList<int> *)in_RDI);
    }
    QList<int>::~QList((QList<int> *)0x6f473e);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (QList<int> *)in_RDI;
}

Assistant:

QList<int> QToolBarAreaLayout::gapIndex(const QPoint &pos) const
{
    Qt::LayoutDirection dir = mainWindow->layoutDirection();
    int minDistance = 80; // when a dock area is empty, how "wide" is it?
    QList<int> ret; //return value
    for (int i = 0; i < QInternal::DockCount; ++i) {
        QPoint p = pos;
        if (docks[i].o == Qt::Horizontal)
            p = QStyle::visualPos(dir, docks[i].rect, p);
        QList<int> result = docks[i].gapIndex(p, &minDistance);
        if (!result.isEmpty()) {
            result.prepend(i);
            ret = result;
        }
    }

    return ret;
}